

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NPA.cpp
# Opt level: O2

void __thiscall OpenMD::NPA::evolveEtaB(NPA *this)

{
  RectMatrix<double,_3U,_3U>::operator=
            ((RectMatrix<double,_3U,_3U> *)&this->prevEta,(RectMatrix<double,_3U,_3U> *)&this->eta);
  (this->eta).super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2][2] =
       (((this->super_NPT).targetPressure / -163882576.0 +
        (this->super_NPT).press.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_
        [2][2]) *
       (this->super_NPT).super_VelocityVerletIntegrator.super_Integrator.dt2 *
       (this->super_NPT).instaVol) / ((this->super_NPT).NkBT * (this->super_NPT).tb2) +
       (this->oldEta).super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2][2];
  return;
}

Assistant:

void NPA::evolveEtaB() {
    prevEta = eta;
    eta(2, 2) =
        oldEta(2, 2) +
        dt2 * instaVol *
            (press(2, 2) - targetPressure / Constants::pressureConvert) /
            (NkBT * tb2);
  }